

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::ExtensionSet(ExtensionSet *this)

{
  ArenaImpl *this_00;
  unsigned_long uVar1;
  size_t *in_RDI;
  size_t n;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  LogMessage *in_stack_fffffffffffffec0;
  type_info *in_stack_fffffffffffffec8;
  Arena *in_stack_fffffffffffffed0;
  size_t n_00;
  void *local_f0;
  void *local_70;
  type_info local_48 [56];
  ArenaImpl *local_10;
  size_t local_8;
  
  *in_RDI = 0;
  *(undefined2 *)(in_RDI + 1) = 0;
  *(undefined2 *)((long)in_RDI + 10) = 0;
  if ((short)in_RDI[1] == 0) {
    local_f0 = (void *)0x0;
  }
  else {
    n_00 = *in_RDI;
    this_00 = (ArenaImpl *)(ulong)(ushort)in_RDI[1];
    uVar1 = std::numeric_limits<unsigned_long>::max();
    if ((ArenaImpl *)(uVar1 >> 5) < this_00) {
      LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffed0,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      LogMessage::operator<<
                (in_stack_fffffffffffffec0,
                 (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      LogMessage::operator<<
                (in_stack_fffffffffffffec0,
                 (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffec0,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      LogMessage::~LogMessage((LogMessage *)0x46ae4a);
    }
    if (n_00 == 0) {
      local_70 = operator_new__((long)this_00 << 5);
    }
    else {
      local_10 = this_00;
      local_8 = n_00;
      uVar1 = std::numeric_limits<unsigned_long>::max();
      if ((ArenaImpl *)(uVar1 >> 5) < this_00) {
        in_stack_fffffffffffffec8 = local_48;
        LogMessage::LogMessage
                  ((LogMessage *)in_stack_fffffffffffffed0,
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        in_stack_fffffffffffffed0 =
             (Arena *)LogMessage::operator<<
                                (in_stack_fffffffffffffec0,
                                 (char *)CONCAT44(in_stack_fffffffffffffebc,
                                                  in_stack_fffffffffffffeb8));
        in_stack_fffffffffffffec0 =
             LogMessage::operator<<
                       (in_stack_fffffffffffffec0,
                        (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffec0,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        LogMessage::~LogMessage((LogMessage *)0x46af93);
      }
      AlignUpTo8((long)local_10 << 5);
      Arena::AllocHook(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                       (size_t)in_stack_fffffffffffffec0);
      local_70 = ArenaImpl::AllocateAligned(this_00,n_00);
    }
    local_f0 = local_70;
  }
  in_RDI[2] = (size_t)local_f0;
  return;
}

Assistant:

ExtensionSet::ExtensionSet()
    : arena_(NULL),
      flat_capacity_(0),
      flat_size_(0),
      map_{flat_capacity_ == 0
               ? NULL
               : Arena::CreateArray<KeyValue>(arena_, flat_capacity_)} {}